

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O2

void __thiscall SkillTree::drawSelf(SkillTree *this,PixelGameEngine *pge,int64_t *internetPoints)

{
  key_type *pkVar1;
  mapped_type *pmVar2;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dependency;
  key_type *__k;
  __node_base *p_Var4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>_>
  *__range1;
  __node_base *p_Var5;
  vi2d local_40;
  vi2d local_38;
  
  p_Var5 = &(this->nodes)._M_h._M_before_begin;
  p_Var4 = p_Var5;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    SkillTreeNode::drawSelf((SkillTreeNode *)(p_Var4 + 5),pge);
    pkVar1 = (key_type *)p_Var4[0x11]._M_nxt;
    for (__k = (key_type *)p_Var4[0x10]._M_nxt; __k != pkVar1; __k = __k + 1) {
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      paVar3 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::RED;
      if (pmVar2->completed != false) {
        paVar3 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::GREEN;
      }
      local_38.x = (int)((pmVar2->pos).x * 16.0 + 4.0 + 80.0);
      local_38.y = (int)((pmVar2->pos).y * 16.0 + 4.0 + 180.0);
      local_40.x = (int)(SUB84(p_Var4[0x13]._M_nxt,0) * 16.0 + 4.0 + 80.0);
      local_40.y = (int)((float)((ulong)p_Var4[0x13]._M_nxt >> 0x20) * 16.0 + 4.0 + 180.0);
      olc::PixelGameEngine::DrawLine(pge,&local_38,&local_40,(Pixel)paVar3->field_1,0xffffffff);
    }
  }
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    SkillTreeNode::drawExplanation((SkillTreeNode *)(p_Var5 + 5),pge,internetPoints);
  }
  return;
}

Assistant:

void SkillTree::drawSelf(olc::PixelGameEngine *pge, std::int64_t &internetPoints) const {
    for (auto &node : nodes) {
	node.second.drawSelf(pge);
	for (const auto &dependency : node.second.getDependecies()) {
	    const auto &depNode = nodes.at(dependency);
	    const auto posFrom = depNode.getPos() * 16 + olc::vi2d{4, 4};
	    const auto posTo = node.second.getPos() * 16 + olc::vi2d{4, 4};
	    const auto color = depNode.isCompleted() ? olc::GREEN : olc::RED;
	    pge->DrawLine(posFrom + olc::vf2d{80, 180}, posTo + olc::vf2d{80, 180}, color);
	}
    }
    for (auto &node : nodes) {
	node.second.drawExplanation(pge, internetPoints);
    }
}